

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O3

bool __thiscall Minisat::Solver::isSimplifyDuplicate(Solver *this,CRef cr)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  unsigned_long *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t uVar10;
  ulong uVar11;
  
  uVar2 = (this->simplifyBuffer).ring.sz;
  uVar7 = 0;
  if ((ulong)uVar2 != 0) {
    puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
    puVar1 = (ulong *)(puVar4 + cr);
    if ((int)uVar2 < 1) {
LAB_001132fa:
      if ((uint)uVar7 != uVar2) {
        uVar10 = this->counter + 1;
        this->counter = uVar10;
        uVar9 = *puVar1 >> 0x22;
        if (uVar9 != 0) {
          puVar5 = (this->seen2).data;
          uVar8 = 0;
          do {
            puVar5[*(int *)((long)puVar1 + uVar8 * 4 + 8)] = uVar10;
            uVar8 = uVar8 + 1;
            uVar9 = *puVar1 >> 0x22;
          } while (uVar8 < uVar9);
        }
        if ((int)(uint)uVar7 < (int)uVar2) {
          uVar8 = uVar7 & 0xffffffff;
          do {
            uVar3 = (this->simplifyBuffer).ring.data[uVar8];
            if (uVar3 != cr && uVar3 != 0xffffffff) {
              uVar7 = *(ulong *)(puVar4 + uVar3);
              uVar6 = (uint)(uVar7 >> 0x22);
              if ((uint)uVar9 == uVar6) {
                uVar11 = 0;
                if (0x3ffffffff < uVar7) {
                  uVar11 = 0;
                  while ((this->seen2).data[(int)puVar4[(ulong)uVar3 + uVar11 + 2]] == this->counter
                        ) {
                    uVar11 = uVar11 + 1;
                    if (uVar7 >> 0x22 == uVar11) goto LAB_001133bb;
                  }
                }
                if ((uint)uVar11 == uVar6) {
LAB_001133bb:
                  uVar7 = 1;
                  break;
                }
              }
            }
            uVar8 = uVar8 + 1;
            uVar7 = 0;
          } while ((int)uVar8 < (int)uVar2);
          goto LAB_001133c9;
        }
      }
    }
    else {
      uVar7 = 0;
      do {
        uVar3 = (this->simplifyBuffer).ring.data[uVar7];
        if ((uVar3 != cr && uVar3 != 0xffffffff) &&
           ((*(ulong *)(puVar4 + uVar3) ^ *puVar1) < 0x400000000)) goto LAB_001132fa;
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
    uVar7 = 0;
  }
LAB_001133c9:
  return SUB81(uVar7,0);
}

Assistant:

int size(void) const { return sz; }